

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void reportLpColVectors(HighsLogOptions *log_options,HighsLp *lp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pHVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer piVar6;
  char *pcVar7;
  HighsInt iCol;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  string integer_column;
  string type;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (0 < (long)lp->num_col_) {
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    pHVar3 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish == pHVar3) {
      bVar11 = true;
    }
    else {
      lVar8 = 0;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + (uint)(pHVar3[lVar8] == kInteger);
        lVar8 = lVar8 + 1;
      } while (lp->num_col_ != lVar8);
      bVar11 = iVar9 == 0;
    }
    pbVar4 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    highsLogUser(log_options,kInfo,
                 "  Column        Lower        Upper         Cost       Type        Count");
    if (!bVar11) {
      highsLogUser(log_options,kInfo,"  Discrete");
    }
    if (pbVar5 != pbVar4) {
      highsLogUser(log_options,kInfo,"  Name");
    }
    highsLogUser(log_options,kInfo,"\n");
    paVar1 = &local_70.field_2;
    lVar8 = 0;
    for (uVar10 = 0; (long)uVar10 < (long)lp->num_col_; uVar10 = uVar10 + 1) {
      getBoundType_abi_cxx11_
                (&local_70,
                 (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10],
                 (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10]);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      highsLogUser(log_options,kInfo,"%8d %12g %12g %12g         %2s %12d",
                   (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10],
                   (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10],
                   (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10],uVar10 & 0xffffffff,local_50,
                   (ulong)(uint)(piVar6[uVar10 + 1] - piVar6[uVar10]));
      if (!bVar11) {
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
        if ((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10] == kInteger) {
          dVar2 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
LAB_00241dd1:
            pcVar7 = "Integer";
          }
          else {
            dVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
            pcVar7 = "Binary";
            if ((dVar2 != 1.0) || (NAN(dVar2))) goto LAB_00241dd1;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_70,0,(char *)local_70._M_string_length,(ulong)pcVar7);
        }
        highsLogUser(log_options,kInfo,"  %-8s",local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      if (pbVar5 != pbVar4) {
        highsLogUser(log_options,kInfo,"  %-s",
                     *(undefined8 *)
                      ((long)&(((lp->col_names_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar8));
      }
      lVar8 = lVar8 + 0x20;
      highsLogUser(log_options,kInfo,"\n");
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

void reportLpColVectors(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_col_ <= 0) return;
  std::string type;
  HighsInt count;
  bool have_integer_columns = (getNumInt(lp) != 0);
  bool have_col_names = (lp.col_names_.size() != 0);

  highsLogUser(log_options, HighsLogType::kInfo,
               "  Column        Lower        Upper         Cost       "
               "Type        Count");
  if (have_integer_columns)
    highsLogUser(log_options, HighsLogType::kInfo, "  Discrete");
  if (have_col_names) highsLogUser(log_options, HighsLogType::kInfo, "  Name");
  highsLogUser(log_options, HighsLogType::kInfo, "\n");

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    type = getBoundType(lp.col_lower_[iCol], lp.col_upper_[iCol]);
    count = lp.a_matrix_.start_[iCol + 1] - lp.a_matrix_.start_[iCol];
    highsLogUser(log_options, HighsLogType::kInfo,
                 "%8" HIGHSINT_FORMAT
                 " %12g %12g %12g         %2s %12" HIGHSINT_FORMAT "",
                 iCol, lp.col_lower_[iCol], lp.col_upper_[iCol],
                 lp.col_cost_[iCol], type.c_str(), count);
    if (have_integer_columns) {
      std::string integer_column = "";
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) {
          integer_column = "Binary";
        } else {
          integer_column = "Integer";
        }
      }
      highsLogUser(log_options, HighsLogType::kInfo, "  %-8s",
                   integer_column.c_str());
    }
    if (have_col_names)
      highsLogUser(log_options, HighsLogType::kInfo, "  %-s",
                   lp.col_names_[iCol].c_str());
    highsLogUser(log_options, HighsLogType::kInfo, "\n");
  }
}